

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDestinationRecord.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::EntityDestinationRecord::operator==
          (EntityDestinationRecord *this,EntityDestinationRecord *Value)

{
  KBOOL KVar1;
  
  KVar1 = EntityIdentifier::operator!=(&this->m_Entity,&Value->m_Entity);
  if ((((KVar1) || (this->m_ui16DstCommsDvcID != Value->m_ui16DstCommsDvcID)) ||
      (this->m_ui8DstLineID != Value->m_ui8DstLineID)) ||
     (this->m_ui8DstPriority != Value->m_ui8DstPriority)) {
    KVar1 = false;
  }
  else {
    KVar1 = this->m_ui8LnStCmd == Value->m_ui8LnStCmd;
  }
  return KVar1;
}

Assistant:

KBOOL EntityDestinationRecord::operator == ( const EntityDestinationRecord & Value ) const
{
    if( m_Entity            != Value.m_Entity )             return false;
    if( m_ui16DstCommsDvcID != Value.m_ui16DstCommsDvcID )  return false;
    if( m_ui8DstLineID      != Value.m_ui8DstLineID )       return false;
    if( m_ui8DstPriority    != Value.m_ui8DstPriority )     return false;
    if( m_ui8LnStCmd        != Value.m_ui8LnStCmd )         return false;
    return true;
}